

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_socket_finished_connecting_(int fd)

{
  int iVar1;
  int *piVar2;
  socklen_t local_18;
  int local_14;
  socklen_t elen;
  int e;
  int fd_local;
  
  local_18 = 4;
  elen = fd;
  iVar1 = getsockopt(fd,1,4,&local_14,&local_18);
  if (iVar1 < 0) {
    e = -1;
  }
  else if (local_14 == 0) {
    e = 1;
  }
  else if ((local_14 == 4) || (local_14 == 0x73)) {
    e = 0;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = local_14;
    e = -1;
  }
  return e;
}

Assistant:

int
evutil_socket_finished_connecting_(evutil_socket_t fd)
{
	int e;
	ev_socklen_t elen = sizeof(e);

	if (getsockopt(fd, SOL_SOCKET, SO_ERROR, (void*)&e, &elen) < 0)
		return -1;

	if (e) {
		if (EVUTIL_ERR_CONNECT_RETRIABLE(e))
			return 0;
		EVUTIL_SET_SOCKET_ERROR(e);
		return -1;
	}

	return 1;
}